

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O2

void brotli::StoreMetaBlockTrivial
               (uint8_t *input,size_t start_pos,size_t length,size_t mask,bool is_last,
               Command *commands,size_t n_commands,size_t *storage_ix,uint8_t *storage)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  undefined7 in_register_00000081;
  allocator_type local_182d;
  undefined4 local_182c;
  uint8_t *local_1828;
  size_t local_1820;
  size_t local_1818;
  vector<unsigned_short,_std::allocator<unsigned_short>_> dist_bits;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dist_depth;
  vector<unsigned_short,_std::allocator<unsigned_short>_> cmd_bits;
  vector<unsigned_char,_std::allocator<unsigned_char>_> cmd_depth;
  vector<unsigned_short,_std::allocator<unsigned_short>_> lit_bits;
  vector<unsigned_char,_std::allocator<unsigned_char>_> lit_depth;
  HistogramLiteral lit_histo;
  HistogramCommand cmd_histo;
  HistogramDistance dist_histo;
  
  local_182c = (undefined4)CONCAT71(in_register_00000081,is_last);
  StoreCompressedMetaBlockHeader(is_last,length,storage_ix,storage);
  memset(&lit_histo,0,0x408);
  lit_histo.bit_cost_ = INFINITY;
  memset(&cmd_histo,0,0xb08);
  cmd_histo.bit_cost_ = INFINITY;
  memset(&dist_histo,0,0x828);
  dist_histo.bit_cost_ = INFINITY;
  local_1828 = input;
  local_1820 = start_pos;
  local_1818 = mask;
  BuildHistograms(input,start_pos,mask,commands,n_commands,&lit_histo,&cmd_histo,&dist_histo);
  uVar1 = *storage_ix;
  uVar3 = uVar1 >> 3;
  *(ulong *)(storage + uVar3) = (ulong)storage[uVar3];
  *storage_ix = uVar1 + 0xd;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&lit_depth,0x100,(allocator_type *)&lit_bits);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&lit_bits,0x100,(allocator_type *)&cmd_depth);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&cmd_depth,0x2c0,(allocator_type *)&cmd_bits);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&cmd_bits,0x2c0,(allocator_type *)&dist_depth);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&dist_depth,0x40,(allocator_type *)&dist_bits);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&dist_bits,0x40,&local_182d);
  BuildAndStoreHuffmanTree
            (lit_histo.data_,0x100,
             lit_depth.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             lit_bits.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start,storage_ix,storage);
  BuildAndStoreHuffmanTree
            (cmd_histo.data_,0x2c0,
             cmd_depth.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             cmd_bits.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start,storage_ix,storage);
  BuildAndStoreHuffmanTree
            (dist_histo.data_,0x40,
             dist_depth.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             dist_bits.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start,storage_ix,storage);
  StoreDataWithHuffmanCodes
            (local_1828,local_1820,local_1818,commands,n_commands,
             lit_depth.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             lit_bits.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start,
             cmd_depth.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             cmd_bits.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start,
             dist_depth.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             dist_bits.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start,storage_ix,storage);
  if ((char)local_182c != '\0') {
    uVar2 = (int)*storage_ix + 7;
    *storage_ix = (ulong)(uVar2 & 0xfffffff8);
    storage[uVar2 >> 3] = '\0';
  }
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&dist_bits.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&dist_depth.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&cmd_bits.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&cmd_depth.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&lit_bits.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&lit_depth.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void StoreMetaBlockTrivial(const uint8_t* input,
                           size_t start_pos,
                           size_t length,
                           size_t mask,
                           bool is_last,
                           const brotli::Command *commands,
                           size_t n_commands,
                           size_t *storage_ix,
                           uint8_t *storage) {
  StoreCompressedMetaBlockHeader(is_last, length, storage_ix, storage);

  HistogramLiteral lit_histo;
  HistogramCommand cmd_histo;
  HistogramDistance dist_histo;

  BuildHistograms(input, start_pos, mask, commands, n_commands,
                  &lit_histo, &cmd_histo, &dist_histo);

  WriteBits(13, 0, storage_ix, storage);

  std::vector<uint8_t> lit_depth(256);
  std::vector<uint16_t> lit_bits(256);
  std::vector<uint8_t> cmd_depth(kNumCommandPrefixes);
  std::vector<uint16_t> cmd_bits(kNumCommandPrefixes);
  std::vector<uint8_t> dist_depth(64);
  std::vector<uint16_t> dist_bits(64);

  BuildAndStoreHuffmanTree(&lit_histo.data_[0], 256,
                           &lit_depth[0], &lit_bits[0],
                           storage_ix, storage);
  BuildAndStoreHuffmanTree(&cmd_histo.data_[0], kNumCommandPrefixes,
                           &cmd_depth[0], &cmd_bits[0],
                           storage_ix, storage);
  BuildAndStoreHuffmanTree(&dist_histo.data_[0], 64,
                           &dist_depth[0], &dist_bits[0],
                           storage_ix, storage);
  StoreDataWithHuffmanCodes(input, start_pos, mask, commands,
                            n_commands, &lit_depth[0], &lit_bits[0],
                            &cmd_depth[0], &cmd_bits[0],
                            &dist_depth[0], &dist_bits[0],
                            storage_ix, storage);
  if (is_last) {
    JumpToByteBoundary(storage_ix, storage);
  }
}